

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O0

void __thiscall TPZFileStream::ReadData<char>(TPZFileStream *this,char *p,int howMany)

{
  ulong uVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  char buf [100];
  int c;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  undefined1 local_88 [112];
  int local_18;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  uVar1 = std::ios::operator!((void *)(in_RDI + 8 + *(long *)(*(long *)(in_RDI + 8) + -0x18)));
  if ((uVar1 & 1) != 0) {
    pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
  }
  if (local_14 != 0) {
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      std::operator>>((istream *)(in_RDI + 8),(char *)(local_10 + local_18));
    }
    std::istream::getline((char *)(in_RDI + 8),(long)local_88);
  }
  return;
}

Assistant:

void TPZFileStream::ReadData(T *p, int howMany) {
        int c;
        char buf[100];
        if(!fIn)
        {
            DebugStop();
        }
        if(howMany)
        {
            for(c=0; c<howMany; c++) fIn >> p[c];
            fIn.getline(buf,100);
        }
#ifdef PZDEBUG
        if (fIn.bad()) {
            PZError << "TFileStream:Could not read from stream" << std::endl;
            DebugStop();
        }
#endif
    }